

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O0

QuadTerms * __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::ExtractSum(BucketAccum1Type<mp::QuadTerms> *this)

{
  bool bVar1;
  size_type sVar2;
  array<mp::QuadTerms,_64UL> *in_RSI;
  QuadTerms *in_RDI;
  size_t i_bucket;
  QuadTerms *result;
  QuadTerms *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  QuadTerms *this_00;
  undefined1 local_3f1;
  QuadTerms *in_stack_fffffffffffffd10;
  QuadTerms *in_stack_fffffffffffffd18;
  undefined8 local_20;
  
  this_00 = in_RDI;
  QuadTerms::QuadTerms((QuadTerms *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  local_20 = 0;
  do {
    sVar2 = std::array<mp::QuadTerms,_64UL>::size(in_RSI);
    if (sVar2 <= local_20) {
LAB_00510267:
      while( true ) {
        local_20 = local_20 + 1;
        sVar2 = std::array<mp::QuadTerms,_64UL>::size(in_RSI);
        if (sVar2 <= local_20) break;
        in_stack_fffffffffffffbd7 =
             HasBucket((BucketAccum1Type<mp::QuadTerms> *)
                       CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                       (size_t)in_stack_fffffffffffffbc8);
        if ((bool)in_stack_fffffffffffffbd7) {
          in_stack_fffffffffffffbc8 = (QuadTerms *)QuadTerms::size((QuadTerms *)0x5102cf);
          local_3f1 = in_stack_fffffffffffffbc8 == (QuadTerms *)0x0;
          if (local_3f1) {
            ExtractBucket((BucketAccum1Type<mp::QuadTerms> *)this_00,(size_t)in_RDI);
          }
          else {
            ExtractBucket((BucketAccum1Type<mp::QuadTerms> *)this_00,(size_t)in_RDI);
            MergeSorted<mp::QuadTerms>(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
          }
          local_3f1 = !local_3f1;
          QuadTerms::operator=
                    ((QuadTerms *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                     in_stack_fffffffffffffbc8);
          QuadTerms::~QuadTerms
                    ((QuadTerms *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
          if (local_3f1) {
            QuadTerms::~QuadTerms
                      ((QuadTerms *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
          }
        }
      }
      return this_00;
    }
    bVar1 = HasBucket((BucketAccum1Type<mp::QuadTerms> *)
                      CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                      (size_t)in_stack_fffffffffffffbc8);
    if (bVar1) {
      ExtractBucket((BucketAccum1Type<mp::QuadTerms> *)this_00,(size_t)in_RDI);
      QuadTerms::operator=
                ((QuadTerms *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8);
      QuadTerms::~QuadTerms
                ((QuadTerms *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      goto LAB_00510267;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

Body BucketAccum1Type<Body>::ExtractSum() {
  Body result;

  size_t i_bucket = 0;
  for ( ; i_bucket<buckets_.size(); ++i_bucket)
    if (HasBucket(i_bucket)) {
      result = ExtractBucket(i_bucket);
      break;
    }

  while ( ++i_bucket<buckets_.size())
    if (HasBucket(i_bucket)) {
      result
          = result.size()
          ? MergeSorted(ExtractBucket(i_bucket), result)
          : ExtractBucket(i_bucket);
    }

  return result;
}